

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Alias::compile
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Alias *this)

{
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *pMVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  Impl *pIVar5;
  Node *resolver;
  uint64_t uVar6;
  ErrorReporter *errorReporter;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Builder brandBuilder;
  SegmentBuilder *pSVar12;
  StructReader expression;
  undefined8 *ptr;
  Arena *this_00;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_c8;
  StructBuilder local_58;
  
  if (this->initialized == false) {
    this->initialized = true;
    pIVar5 = this->module->compiler;
    _::OrphanBuilder::initStruct
              ((OrphanBuilder *)&local_c8,(pIVar5->workspace).orphanage.arena,
               (pIVar5->workspace).orphanage.capTable,(StructSize)0x10000);
    uVar8 = local_c8.ptr.field_1._16_8_;
    uVar7 = local_c8.ptr.field_1._8_8_;
    uVar6 = CONCAT71(local_c8.ptr._1_7_,local_c8.ptr.isSet);
    pSVar12 = (SegmentBuilder *)CONCAT44(local_c8.ptr.field_1._4_4_,local_c8.ptr.field_1.value.tag);
    if ((this->brandOrphan).builder.segment != (SegmentBuilder *)0x0) {
      _::OrphanBuilder::euthanize(&(this->brandOrphan).builder);
    }
    (this->brandOrphan).builder.segment = pSVar12;
    (this->brandOrphan).builder.capTable = (CapTableBuilder *)uVar7;
    (this->brandOrphan).builder.location = (word *)uVar8;
    (this->brandOrphan).builder.tag.content = uVar6;
    this_00 = &(pIVar5->workspace).arena;
    ptr = (undefined8 *)kj::Arena::allocateBytes(this_00,0x10,8,true);
    *ptr = this;
    *(undefined1 *)(ptr + 1) = 0;
    kj::Arena::setDestructor
              (this_00,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>);
    resolver = this->parent;
    uVar6 = resolver->id;
    uVar4 = resolver->genericParamCount;
    errorReporter = &this->module->parserModule->super_ErrorReporter;
    expression = (this->targetName)._reader;
    _::OrphanBuilder::asStruct(&local_58,&(this->brandOrphan).builder,(StructSize)0x10000);
    brandBuilder._builder.capTable = local_58.capTable;
    brandBuilder._builder.segment = local_58.segment;
    brandBuilder._builder.data = local_58.data;
    brandBuilder._builder.pointers = local_58.pointers;
    brandBuilder._builder.dataSize = local_58.dataSize;
    brandBuilder._builder.pointerCount = local_58.pointerCount;
    brandBuilder._builder._38_2_ = local_58._38_2_;
    NodeTranslator::compileDecl
              (&local_c8,uVar6,uVar4,&resolver->super_Resolver,errorReporter,(Reader)expression,
               brandBuilder);
    pMVar1 = &this->target;
    if (&local_c8 != pMVar1) {
      if (((pMVar1->ptr).isSet == true) &&
         ((this->target).ptr.isSet = false, (this->target).ptr.field_1.value.tag - 1 < 2)) {
        (this->target).ptr.field_1.value.tag = 0;
      }
      if (local_c8.ptr.isSet == true) {
        (this->target).ptr.field_1.value.tag = local_c8.ptr.field_1.value.tag;
        if (local_c8.ptr.field_1.value.tag == 2) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_c8.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_c8.ptr.field_1._16_8_;
        }
        else if (local_c8.ptr.field_1.value.tag == 1) {
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28) = local_c8.ptr.field_1._40_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18) = local_c8.ptr.field_1._24_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20) = local_c8.ptr.field_1._32_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 8) = local_c8.ptr.field_1._8_8_;
          *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10) = local_c8.ptr.field_1._16_8_;
          *(undefined1 *)((long)&(this->target).ptr.field_1 + 0x30) = local_c8.ptr.field_1._48_1_;
          if (local_c8.ptr.field_1._48_1_ == '\x01') {
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58) = local_c8.ptr.field_1._88_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60) = local_c8.ptr.field_1._96_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48) = local_c8.ptr.field_1._72_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50) = local_c8.ptr.field_1._80_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38) = local_c8.ptr.field_1._56_8_;
            *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40) = local_c8.ptr.field_1._64_8_;
          }
        }
        (pMVar1->ptr).isSet = true;
      }
    }
  }
  bVar2 = (this->target).ptr.isSet;
  (__return_storage_ptr__->ptr).isSet = bVar2;
  if (bVar2 == true) {
    uVar4 = (this->target).ptr.field_1.value.tag;
    (__return_storage_ptr__->ptr).field_1.value.tag = uVar4;
    if (uVar4 == 2) {
      uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar7;
    }
    else if (uVar4 == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x28);
      uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 8);
      uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x10);
      uVar9 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x20);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uVar9;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar7;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar8;
      cVar3 = *(char *)((long)&(this->target).ptr.field_1 + 0x30);
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = cVar3;
      if (cVar3 == '\x01') {
        uVar7 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x38);
        uVar8 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x40);
        uVar9 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x48);
        uVar10 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x50);
        uVar11 = *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x60);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) =
             *(undefined8 *)((long)&(this->target).ptr.field_1 + 0x58);
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uVar11;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = uVar9;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uVar10;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = uVar7;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uVar8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult> Compiler::Alias::compile() {
  if (!initialized) {
    initialized = true;

    auto& workspace = module.getCompiler().getWorkspace();
    brandOrphan = workspace.orphanage.newOrphan<schema::Brand>();

    // If the Workspace is destroyed, revert the alias to the uninitialized state, because the
    // orphan we created is no longer valid in this case.
    workspace.arena.copy(kj::defer([this]() {
      initialized = false;
      brandOrphan = Orphan<schema::Brand>();
    }));

    target = NodeTranslator::compileDecl(
        parent.getId(), parent.getParameterCount(), parent,
        module.getErrorReporter(), targetName, brandOrphan.get());
  }

  return target;
}